

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PagerDontWrite(PgHdr *pPg)

{
  Pager *pPager;
  PgHdr *pPg_local;
  
  if (((pPg->pPager->tempFile == '\0') && ((pPg->flags & 2) != 0)) && (pPg->pPager->nSavepoint == 0)
     ) {
    pPg->flags = pPg->flags | 0x10;
    pPg->flags = pPg->flags & 0xfffb;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerDontWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  if( !pPager->tempFile && (pPg->flags&PGHDR_DIRTY) && pPager->nSavepoint==0 ){
    PAGERTRACE(("DONT_WRITE page %d of %d\n", pPg->pgno, PAGERID(pPager)));
    IOTRACE(("CLEAN %p %d\n", pPager, pPg->pgno))
    pPg->flags |= PGHDR_DONT_WRITE;
    pPg->flags &= ~PGHDR_WRITEABLE;
    testcase( pPg->flags & PGHDR_NEED_SYNC );
    pager_set_pagehash(pPg);
  }
}